

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  time_t tVar4;
  per_transfer **per;
  _Bool _Var5;
  _Bool getadded;
  _Bool *local_40;
  CURLM *local_38;
  
  *addedp = false;
  *morep = false;
  CVar2 = create_transfer(global,share,addedp);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  per = &transfers;
  local_40 = morep;
  local_38 = multi;
  _Var1 = false;
LAB_0011529c:
  do {
    _Var5 = _Var1;
    per = &((per_transfer *)per)->next->next;
    if ((per_transfer *)per == (per_transfer *)0x0) {
LAB_0011539a:
      *local_40 = _Var5;
      return CURLE_OK;
    }
    if (global->parallel_max <= all_added) {
      _Var5 = true;
      goto LAB_0011539a;
    }
    getadded = false;
    _Var1 = _Var5;
  } while (((per_transfer *)per)->added != false);
  if (((per_transfer *)per)->startat != 0) {
    tVar4 = time((time_t *)0x0);
    _Var1 = true;
    if (tVar4 < ((per_transfer *)per)->startat) goto LAB_0011529c;
  }
  CVar2 = pre_transfer(global,(per_transfer *)per);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  curl_easy_setopt(((per_transfer *)per)->curl,0xed,global->parallel_connect ^ 1);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2777,per);
  curl_easy_setopt(((per_transfer *)per)->curl,0x4efb,xferinfo_cb);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2749,per);
  iVar3 = curl_multi_add_handle(local_38,((per_transfer *)per)->curl);
  if (iVar3 != 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  CVar2 = create_transfer(global,share,&getadded);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  ((per_transfer *)per)->added = true;
  all_added = all_added + 1;
  *addedp = true;
  _Var1 = _Var5;
  goto LAB_0011529c;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  *addedp = FALSE;
  *morep = FALSE;
  result = create_transfer(global, share, addedp);
  if(result)
    return result;
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    bool getadded = FALSE;
    if(per->added)
      /* already added */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }

    result = pre_transfer(global, per);
    if(result)
      return result;

    /* parallel connect means that we don't set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode)
      return CURLE_OUT_OF_MEMORY;

    result = create_transfer(global, share, &getadded);
    if(result)
      return result;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping) ? TRUE : FALSE;
  return CURLE_OK;
}